

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O1

void __thiscall OpenMesh::IO::_OMReader_::_OMReader_(_OMReader_ *this)

{
  _IOManager_ *this_00;
  _OMReader_ *local_28;
  
  (this->super_BaseReader)._vptr_BaseReader = (_func_int **)&PTR___OMReader__001c3150;
  (this->fileOptions_).flags_ = 0;
  (this->property_name_).super_string._M_dataplus._M_p =
       (pointer)&(this->property_name_).super_string.field_2;
  (this->property_name_).super_string._M_string_length = 0;
  (this->property_name_).super_string.field_2._M_local_buf[0] = '\0';
  this_00 = IOManager();
  local_28 = this;
  std::
  _Rb_tree<OpenMesh::IO::BaseReader*,OpenMesh::IO::BaseReader*,std::_Identity<OpenMesh::IO::BaseReader*>,std::less<OpenMesh::IO::BaseReader*>,std::allocator<OpenMesh::IO::BaseReader*>>
  ::_M_insert_unique<OpenMesh::IO::BaseReader*const&>
            ((_Rb_tree<OpenMesh::IO::BaseReader*,OpenMesh::IO::BaseReader*,std::_Identity<OpenMesh::IO::BaseReader*>,std::less<OpenMesh::IO::BaseReader*>,std::allocator<OpenMesh::IO::BaseReader*>>
              *)this_00,(BaseReader **)&local_28);
  _IOManager_::update_read_filters(this_00);
  return;
}

Assistant:

_OMReader_::_OMReader_()
{
  IOManager().register_module(this);
}